

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::FuncModuleField::~FuncModuleField(FuncModuleField *this)

{
  FuncModuleField *this_local;
  
  ~FuncModuleField(this);
  operator_delete(this);
  return;
}

Assistant:

explicit FuncModuleField(const Location& loc = Location(),
                           string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Func>(loc), func(name) {}